

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRboStateQueryTests.cpp
# Opt level: O2

void deqp::gles3::Functional::anon_unknown_1::checkRenderbufferComponentSize
               (TestContext *testCtx,CallLogWrapper *gl,int r,int g,int b,int a,int d,int s)

{
  ostringstream *this;
  bool bVar1;
  MessageBuilder *this_00;
  long lVar2;
  StateQueryMemoryWriteGuard<int> state;
  int referenceSizes [6];
  undefined1 local_1b0 [384];
  
  referenceSizes[0] = r;
  referenceSizes[1] = g;
  referenceSizes[2] = b;
  referenceSizes[3] = a;
  referenceSizes[4] = d;
  referenceSizes[5] = s;
  this = (ostringstream *)(local_1b0 + 8);
  lVar2 = 0;
  do {
    if (lVar2 == 0x18) {
      return;
    }
    if (*(int *)((long)referenceSizes + lVar2) != -1) {
      deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard(&state)
      ;
      glu::CallLogWrapper::glGetRenderbufferParameteriv
                (gl,0x8d41,*(GLenum *)((long)&DAT_0185f440 + lVar2),&state.m_value);
      bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                        (&state,testCtx);
      if (!bVar1) {
        return;
      }
      if (state.m_value < *(int *)((long)referenceSizes + lVar2)) {
        local_1b0._0_8_ = testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream(this);
        std::operator<<((ostream *)this,"// ERROR: Expected greater or equal to ");
        this_00 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1b0,(int *)((long)referenceSizes + lVar2));
        std::operator<<(&(this_00->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                        "; got ");
        std::ostream::operator<<(&this_00->m_str,state.m_value);
        tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this);
        if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
          tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"got invalid value");
        }
      }
    }
    lVar2 = lVar2 + 4;
  } while( true );
}

Assistant:

void checkRenderbufferComponentSize (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, int r, int g, int b, int a, int d, int s)
{
	using tcu::TestLog;

	const int referenceSizes[] = {r, g, b, a, d, s};
	const GLenum paramNames[] =
	{
		GL_RENDERBUFFER_RED_SIZE,
		GL_RENDERBUFFER_GREEN_SIZE,
		GL_RENDERBUFFER_BLUE_SIZE,
		GL_RENDERBUFFER_ALPHA_SIZE,
		GL_RENDERBUFFER_DEPTH_SIZE,
		GL_RENDERBUFFER_STENCIL_SIZE
	};

	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(referenceSizes) == DE_LENGTH_OF_ARRAY(paramNames));

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(referenceSizes); ++ndx)
	{
		if (referenceSizes[ndx] == -1)
			continue;

		StateQueryMemoryWriteGuard<GLint> state;
		gl.glGetRenderbufferParameteriv(GL_RENDERBUFFER, paramNames[ndx], &state);

		if (!state.verifyValidity(testCtx))
			return;

		if (state < referenceSizes[ndx])
		{
			testCtx.getLog() << TestLog::Message << "// ERROR: Expected greater or equal to " << referenceSizes[ndx] << "; got " << state << TestLog::EndMessage;
			if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
				testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid value");
		}
	}
}